

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void dump_nodes(nodes_list_t *n)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)n;
  while (p_Var2 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)n) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[1]._M_next);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)&p_Var2[1]._M_next + 4));
    std::operator<<(poVar1,") ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void dump_nodes(const nodes_list_t& n)
{
    nodes_list_t::const_iterator i = n.begin();
    while (i != n.end())
    {
        std::cerr << "(" << i->first << ", " << i->second << ") ";
        i++;
    }
    std::cerr << std::endl;
}